

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompOpEvalPredicate
               (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodeSetPtr set,int minPos,
               int maxPos,int hasNsNodes)

{
  int *piVar1;
  xmlXPathStepOp *pxVar2;
  long lVar3;
  int iVar4;
  
  lVar3 = (long)op->ch1;
  if (lVar3 == -1) {
LAB_001c5b58:
    if (op->ch2 == -1) {
      return;
    }
    xmlXPathNodeSetFilter(ctxt,set,op->ch2,minPos,maxPos,hasNsNodes);
    return;
  }
  pxVar2 = ctxt->comp->steps;
  if (pxVar2[lVar3].op == XPATH_OP_PREDICATE) {
    iVar4 = ctxt->context->depth;
    if (iVar4 < 5000) {
      ctxt->context->depth = iVar4 + 1;
      xmlXPathCompOpEvalPredicate(ctxt,pxVar2 + lVar3,set,1,set->nodeNr,hasNsNodes);
      piVar1 = &ctxt->context->depth;
      *piVar1 = *piVar1 + -1;
      if (ctxt->error != 0) {
        return;
      }
      goto LAB_001c5b58;
    }
    iVar4 = 0x1a;
  }
  else {
    iVar4 = 10;
  }
  xmlXPathErr(ctxt,iVar4);
  return;
}

Assistant:

static void
xmlXPathCompOpEvalPredicate(xmlXPathParserContextPtr ctxt,
			    xmlXPathStepOpPtr op,
			    xmlNodeSetPtr set,
                            int minPos, int maxPos,
			    int hasNsNodes)
{
    if (op->ch1 != -1) {
	xmlXPathCompExprPtr comp = ctxt->comp;
	/*
	* Process inner predicates first.
	*/
	if (comp->steps[op->ch1].op != XPATH_OP_PREDICATE) {
            XP_ERROR(XPATH_INVALID_OPERAND);
	}
        if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
            XP_ERROR(XPATH_RECURSION_LIMIT_EXCEEDED);
        ctxt->context->depth += 1;
	xmlXPathCompOpEvalPredicate(ctxt, &comp->steps[op->ch1], set,
                                    1, set->nodeNr, hasNsNodes);
        ctxt->context->depth -= 1;
	CHECK_ERROR;
    }

    if (op->ch2 != -1)
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, minPos, maxPos, hasNsNodes);
}